

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lys_array_add_mod_ref(lysc_ctx *ctx,lys_module *mod,lys_module ***mod_array)

{
  lys_module **pplVar1;
  lys_module **pplVar2;
  long *plVar3;
  lys_module *plVar4;
  lys_module *plVar5;
  
  pplVar2 = *mod_array;
  plVar4 = (lys_module *)0x0;
  while( true ) {
    if (pplVar2 == (lys_module **)0x0) {
      plVar5 = (lys_module *)0x0;
    }
    else {
      plVar5 = pplVar2[-1];
    }
    if (plVar5 <= plVar4) break;
    pplVar1 = pplVar2 + (long)plVar4;
    plVar4 = (lys_module *)((long)&plVar4->ctx + 1);
    if (*pplVar1 == mod) {
      return LY_EEXIST;
    }
  }
  if (pplVar2 == (lys_module **)0x0) {
    plVar3 = (long *)malloc(0x10);
    if (plVar3 != (long *)0x0) {
      *plVar3 = 1;
      goto LAB_001556bd;
    }
  }
  else {
    plVar4 = pplVar2[-1];
    pplVar2[-1] = (lys_module *)((long)&plVar4->ctx + 1);
    plVar3 = (long *)realloc(pplVar2 + -1,(long)plVar4 * 8 + 0x10);
    if (plVar3 != (long *)0x0) {
LAB_001556bd:
      *mod_array = (lys_module **)(plVar3 + 1);
      plVar3[*plVar3] = (long)mod;
      return LY_SUCCESS;
    }
    (*mod_array)[-1] = (lys_module *)&(*mod_array)[-1][-1].field_0x7f;
  }
  ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_array_add_mod_ref");
  return LY_EMEM;
}

Assistant:

static LY_ERR
lys_array_add_mod_ref(struct lysc_ctx *ctx, struct lys_module *mod, struct lys_module ***mod_array)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lys_module **new_mod;

    LY_ARRAY_FOR(*mod_array, u) {
        if ((*mod_array)[u] == mod) {
            /* already there */
            return LY_EEXIST;
        }
    }

    /* add the new module ref */
    LY_ARRAY_NEW_RET(ctx->ctx, *mod_array, new_mod, LY_EMEM);
    *new_mod = mod;

    return LY_SUCCESS;
}